

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

int omp_get_partition_num_places_(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  iVar3 = 0;
  if (__kmp_affin_mask_size != 0) {
    iVar3 = __kmp_get_global_thread_id_reg();
    uVar1 = (__kmp_threads[iVar3]->th).th_first_place;
    uVar2 = (__kmp_threads[iVar3]->th).th_last_place;
    iVar3 = 0;
    if (-1 < (int)(uVar1 | uVar2)) {
      uVar4 = 0;
      if (uVar2 < uVar1) {
        uVar4 = __kmp_affinity_num_masks;
      }
      iVar3 = (uVar2 - uVar1) + uVar4 + 1;
    }
  }
  return iVar3;
}

Assistant:

int FTN_STDCALL FTN_GET_PARTITION_NUM_PLACES(void) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  int gtid, num_places, first_place, last_place;
  kmp_info_t *thread;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  first_place = thread->th.th_first_place;
  last_place = thread->th.th_last_place;
  if (first_place < 0 || last_place < 0)
    return 0;
  if (first_place <= last_place)
    num_places = last_place - first_place + 1;
  else
    num_places = __kmp_affinity_num_masks - first_place + last_place + 1;
  return num_places;
#endif
}